

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O0

dispatcher_ref_t __thiscall
so_5::impl::disp_repository_t::query_named_dispatcher(disp_repository_t *this,string *disp_name)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  dispatcher_ref_t dVar3;
  _Self local_48 [3];
  _Self local_30;
  iterator it;
  read_lock_guard_t<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> lock;
  string *disp_name_local;
  disp_repository_t *this_local;
  
  read_lock_guard_t<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::read_lock_guard_t
            ((read_lock_guard_t<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> *)&it,
             (rw_spinlock_t<so_5::yield_backoff_t> *)(disp_name + 0x78));
  if (*(int *)(disp_name + 0x70) == 1) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
                 *)(disp_name + 0x10),in_RDX);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
                *)(disp_name + 0x10));
    bVar1 = std::operator!=(local_48,&local_30);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
               ::operator->(&local_30);
      std::shared_ptr<so_5::dispatcher_t>::shared_ptr
                ((shared_ptr<so_5::dispatcher_t> *)this,&ppVar2->second);
      goto LAB_00499cb0;
    }
  }
  std::shared_ptr<so_5::dispatcher_t>::shared_ptr((shared_ptr<so_5::dispatcher_t> *)this);
LAB_00499cb0:
  read_lock_guard_t<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::~read_lock_guard_t
            ((read_lock_guard_t<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> *)&it);
  dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (dispatcher_ref_t)dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

dispatcher_ref_t
disp_repository_t::query_named_dispatcher(
	const std::string & disp_name )
{
	read_lock_guard_t< default_rw_spinlock_t > lock( m_lock );
	if( state_t::started == m_state )
	{
		named_dispatcher_map_t::iterator it =
			m_named_dispatcher_map.find( disp_name );

		if( m_named_dispatcher_map.end() != it )
		{
			return it->second;
		}
	}

	return dispatcher_ref_t();
}